

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O0

Var Js::JavascriptMath::Decrement_InPlace
              (Var aRight,ScriptContext *scriptContext,JavascriptNumber *result)

{
  bool bVar1;
  double value;
  double dec;
  JavascriptNumber *result_local;
  ScriptContext *scriptContext_local;
  Var aRight_local;
  
  bVar1 = TaggedInt::Is(aRight);
  if (bVar1) {
    aRight_local = TaggedInt::Decrement(aRight,scriptContext);
  }
  else {
    bVar1 = VarIs<Js::JavascriptBigInt>(aRight);
    if (bVar1) {
      aRight_local = JavascriptBigInt::Decrement(aRight);
    }
    else {
      value = Decrement_Helper(aRight,scriptContext);
      aRight_local = JavascriptNumber::InPlaceNew(value,scriptContext,result);
    }
  }
  return aRight_local;
}

Assistant:

Var JavascriptMath::Decrement_InPlace(Var aRight, ScriptContext* scriptContext, JavascriptNumber* result)
        {
            JIT_HELPER_REENTRANT_HEADER(Op_DecrementInPlace);
            if (TaggedInt::Is(aRight))
            {
                return TaggedInt::Decrement(aRight, scriptContext);
            }
            if (VarIs<JavascriptBigInt>(aRight))
            {
                return JavascriptBigInt::Decrement(aRight);
            }

            double dec = Decrement_Helper(aRight,scriptContext);
            return JavascriptNumber::InPlaceNew(dec, scriptContext, result);
            JIT_HELPER_END(Op_DecrementInPlace);
        }